

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O3

void __thiscall stackjit::ExecutionEngine::load(ExecutionEngine *this,bool loadFunctionBodies)

{
  Function *this_00;
  AssemblyImage *this_01;
  pointer pcVar1;
  ExecutionEngine *pEVar2;
  bool bVar3;
  Binder *this_02;
  vector<stackjit::AssemblyImage_*,_std::allocator<stackjit::AssemblyImage_*>_> *pvVar4;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Function,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Function>_>_>
  *puVar5;
  string *psVar6;
  ClassType *this_03;
  ClassMetadata *this_04;
  FunctionDefinition *funcDef_00;
  ClassMetadataProvider *this_05;
  runtime_error *this_06;
  long *plVar7;
  size_type *psVar8;
  pointer ppAVar9;
  pointer ppAVar10;
  _Hash_node_base *p_Var11;
  string signature;
  FunctionDefinition funcDef;
  FunctionSignature local_200;
  ExecutionEngine *local_1e0;
  FunctionLoader *local_1d8;
  string local_1d0;
  pointer local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a8;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  FunctionDefinition local_160;
  FunctionDefinition local_c8;
  
  this_02 = VMState::binder(this->mVMState);
  if (this->mHasMainInitialized == false) {
    loadRuntimeLibrary(this);
  }
  ClassLoader::loadClasses(&this->mClassLoader,&this->mImageContainer);
  if (this->mHasMainInitialized == false) {
    NativeLibrary::add(this->mVMState);
    if ((this->mVMState->config).testMode == true) {
      TestLibrary::add(this->mVMState);
    }
    this->mHasMainInitialized = true;
  }
  local_1e0 = this;
  pvVar4 = ImageContainer::images(&this->mImageContainer);
  ppAVar10 = (pvVar4->
             super__Vector_base<stackjit::AssemblyImage_*,_std::allocator<stackjit::AssemblyImage_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppAVar9 = (pvVar4->
            super__Vector_base<stackjit::AssemblyImage_*,_std::allocator<stackjit::AssemblyImage_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppAVar10 != ppAVar9) {
    local_1d8 = &local_1e0->mFunctionLoader;
    local_1a8 = &local_160.mMemberName.field_2;
    local_1b0 = ppAVar9;
    do {
      bVar3 = AssemblyImage::hasLoadedDefinitions(*ppAVar10);
      if (!bVar3) {
        puVar5 = AssemblyImage::functions_abi_cxx11_(*ppAVar10);
        for (p_Var11 = (puVar5->_M_h)._M_before_begin._M_nxt; p_Var11 != (_Hash_node_base *)0x0;
            p_Var11 = p_Var11->_M_nxt) {
          FunctionDefinition::FunctionDefinition(&local_c8);
          if (loadFunctionBodies) {
            this_01 = *ppAVar10;
            local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1a0,p_Var11[1]._M_nxt,
                       (long)&(p_Var11[1]._M_nxt)->_M_nxt + (long)&(p_Var11[2]._M_nxt)->_M_nxt);
            AssemblyImage::loadFunctionBody(this_01,&local_1a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p);
            }
          }
          this_00 = (Function *)(p_Var11 + 5);
          bVar3 = Loader::Function::isExternal(this_00);
          if (bVar3) {
            FunctionLoader::loadExternal(local_1d8,this_00,&local_c8);
          }
          else {
            FunctionLoader::generateDefinition(local_1d8,this_00,&local_c8);
            FunctionSignature::from(&local_200,&local_c8);
            psVar6 = FunctionSignature::str_abi_cxx11_(&local_200);
            local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
            pcVar1 = (psVar6->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1d0,pcVar1,pcVar1 + psVar6->_M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_200.mSignature._M_dataplus._M_p != &local_200.mSignature.field_2) {
              operator_delete(local_200.mSignature._M_dataplus._M_p);
            }
            bVar3 = Binder::isDefined(this_02,&local_1d0);
            if (bVar3) {
              this_06 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::operator+(&local_180,"The function \'",&local_1d0);
              plVar7 = (long *)std::__cxx11::string::append((char *)&local_180);
              local_200.mSignature._M_dataplus._M_p = (pointer)*plVar7;
              psVar8 = (size_type *)(plVar7 + 2);
              if ((size_type *)local_200.mSignature._M_dataplus._M_p == psVar8) {
                local_200.mSignature.field_2._M_allocated_capacity = *psVar8;
                local_200.mSignature.field_2._8_8_ = plVar7[3];
                local_200.mSignature._M_dataplus._M_p = (pointer)&local_200.mSignature.field_2;
              }
              else {
                local_200.mSignature.field_2._M_allocated_capacity = *psVar8;
              }
              local_200.mSignature._M_string_length = plVar7[1];
              *plVar7 = (long)psVar8;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              std::runtime_error::runtime_error(this_06,(string *)&local_200);
              __cxa_throw(this_06,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p);
            }
          }
          FunctionDefinition::FunctionDefinition(&local_160,&local_c8);
          Binder::define(this_02,&local_160);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160.mMemberName._M_dataplus._M_p != local_1a8) {
            operator_delete(local_160.mMemberName._M_dataplus._M_p);
          }
          if (local_160.mCallParameters.
              super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_160.mCallParameters.
                            super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_160.mParameters.
              super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_160.mParameters.
                            super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160.mName._M_dataplus._M_p != &local_160.mName.field_2) {
            operator_delete(local_160.mName._M_dataplus._M_p);
          }
          bVar3 = FunctionDefinition::isVirtual(&local_c8);
          if (bVar3) {
            this_03 = FunctionDefinition::classType(&local_c8);
            this_04 = ClassType::metadata(this_03);
            funcDef_00 = Binder::getFunction(this_02,(string *)(p_Var11 + 1));
            ClassMetadata::addVirtualFunction(this_04,funcDef_00);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8.mMemberName._M_dataplus._M_p != &local_c8.mMemberName.field_2) {
            operator_delete(local_c8.mMemberName._M_dataplus._M_p);
          }
          if (local_c8.mCallParameters.
              super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_c8.mCallParameters.
                            super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_c8.mParameters.
              super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_c8.mParameters.
                            super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8.mName._M_dataplus._M_p != &local_c8.mName.field_2) {
            operator_delete(local_c8.mName._M_dataplus._M_p);
          }
        }
        AssemblyImage::loadedDefinitions(*ppAVar10);
        ppAVar9 = local_1b0;
      }
      ppAVar10 = ppAVar10 + 1;
    } while (ppAVar10 != ppAVar9);
  }
  pEVar2 = local_1e0;
  this_05 = VMState::classProvider(local_1e0->mVMState);
  ClassMetadataProvider::createVirtualFunctionTables(this_05,pEVar2->mVMState);
  return;
}

Assistant:

void ExecutionEngine::load(bool loadFunctionBodies) {
		auto& binder = mVMState.binder();

		if (!mHasMainInitialized) {
			//Load runtime library
			loadRuntimeLibrary();
		}

		//Load classes
		mClassLoader.loadClasses(mImageContainer);

		if (!mHasMainInitialized) {
			//Load native functions
			NativeLibrary::add(mVMState);

			//Load test functions
			if (mVMState.config.testMode) {
				TestLibrary::add(mVMState);
			}

			mHasMainInitialized = true; //Mark that the main initialization has been made
		}

		//Load functions
		for (auto& image : mImageContainer.images()) {
			if (image->hasLoadedDefinitions()) {
				continue;
			}

			for (auto& current : image->functions()) {
				auto& currentFunc = current.second;
				FunctionDefinition funcDef;

				if (loadFunctionBodies) {
					image->loadFunctionBody(current.first);
				}

				if (!currentFunc.isExternal()) {
					mFunctionLoader.generateDefinition(currentFunc, funcDef);

					auto signature = FunctionSignature::from(funcDef).str();
					if (binder.isDefined(signature)) {
						throw std::runtime_error("The function '" + signature + "' is already defined.");
					}
				} else {
					mFunctionLoader.loadExternal(currentFunc, funcDef);
				}

				binder.define(funcDef);

				//Add virtual functions to the class
				if (funcDef.isVirtual()) {
					funcDef.classType()->metadata()->addVirtualFunction(binder.getFunction(current.first));
				}
			}

			image->loadedDefinitions();
		}

		//Create virtual function tables
		mVMState.classProvider().createVirtualFunctionTables(mVMState);
	}